

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void set_sgb_attr_block(Emulator *e,int x0,int y0,int x1,int y1,u8 pal)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  if (y0 <= y1) {
    uVar3 = x0 + y0 * 0x14;
    do {
      iVar2 = x0 * 2;
      iVar5 = (x1 - x0) + 1;
      uVar4 = uVar3;
      if (x0 <= x1) {
        do {
          bVar1 = (byte)iVar2 & 6;
          (e->state).sgb.attr_map[uVar4 >> 2] =
               pal << (bVar1 ^ 6) | (e->state).sgb.attr_map[uVar4 >> 2] & (byte)(-0xc1 >> bVar1);
          uVar4 = uVar4 + 1;
          iVar2 = iVar2 + 2;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      uVar3 = uVar3 + 0x14;
      bVar6 = y0 != y1;
      y0 = y0 + 1;
    } while (bVar6);
  }
  return;
}

Assistant:

static void set_sgb_attr_block(Emulator* e, int x0, int y0, int x1, int y1,
                               u8 pal) {
  for (int y = y0; y <= y1; ++y) {
    for (int x = x0; x <= x1; ++x) {
      int index = y * 20 + x;
      u8 *byte = &SGB.attr_map[index >> 2];
      u8 mask = ~(0xc0 >> (2 * (x & 3)));
      *byte = (*byte & mask) | (pal << (2 * (3 - (x & 3))));
    }
  }
}